

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O2

bool __thiscall Rml::BaseXMLParser::FindWord(BaseXMLParser *this,String *word,char *terminators)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = this->xml_index;
  do {
    bVar4 = uVar3 < (this->xml_source)._M_string_length;
    if (!bVar4) {
      return bVar4;
    }
    cVar1 = Look(this);
    if (((cVar1 == '\t') || (cVar1 == ' ')) || (cVar1 == '\r')) {
LAB_00252424:
      if (word->_M_string_length != 0) {
        return bVar4;
      }
    }
    else {
      if (cVar1 == '\n') {
        this->line_number = this->line_number + 1;
        goto LAB_00252424;
      }
      if ((terminators != (char *)0x0) &&
         (pcVar2 = strchr(terminators,(int)cVar1), pcVar2 != (char *)0x0)) {
        return word->_M_string_length != 0;
      }
      ::std::__cxx11::string::push_back((char)word);
    }
    uVar3 = this->xml_index + 1;
    this->xml_index = uVar3;
  } while( true );
}

Assistant:

bool BaseXMLParser::FindWord(String& word, const char* terminators)
{
	while (!AtEnd())
	{
		char c = Look();

		// Count line numbers
		if (c == '\n')
		{
			line_number++;
		}

		// Ignore white space
		if (StringUtilities::IsWhitespace(c))
		{
			if (word.empty())
			{
				Next();
				continue;
			}
			else
				return true;
		}

		// Check for termination condition
		if (terminators && strchr(terminators, c))
		{
			return !word.empty();
		}

		word += c;
		Next();
	}

	return false;
}